

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# incppect.cpp
# Opt level: O2

void __thiscall Incppect<false>::Impl::run(Impl *this)

{
  int __fd;
  pointer pbVar1;
  us_socket_context_options_t options;
  undefined1 auVar2 [40];
  unique_ptr<uWS::TemplatedApp<false>,_std::default_delete<uWS::TemplatedApp<false>_>_> uVar3;
  Loop *pLVar4;
  TemplatedApp<false> *pTVar5;
  pointer __rhs;
  allocator<char> local_1f2;
  anon_class_1_0_00000001_for_value_ local_1f1;
  data_accessor local_1f0;
  unique_ptr<uWS::TemplatedApp<false>,_std::default_delete<uWS::TemplatedApp<false>_>_> app;
  data_accessor local_1e0;
  type local_1d8 [2];
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined4 uStack_1a0;
  undefined4 local_19c;
  undefined4 uStack_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  uint uStack_18c;
  string local_188;
  string local_168;
  string local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  WebSocketBehavior local_108;
  
  pLVar4 = uWS::Loop::get((void *)0x0);
  this->mainLoop = pLVar4;
  printf("[incppect] running instance. serving %s from \'%s\'\n","HTTP",
         (this->parameters).httpRoot._M_dataplus._M_p);
  local_108.maxBackpressure = 0x12d000;
  local_108.open.erasure_.vtable_.vtable_ =
       fu2::abi_400::detail::type_erasure::invocation_table::
       function_trait<void_(uWS::WebSocket<false,_true>_*,_uWS::HttpRequest_*)>::empty_invoker<true>
       ::invoke;
  local_108.open.erasure_.vtable_.cmd_ =
       fu2::abi_400::detail::type_erasure::tables::
       vtable<fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<false,_true>_*,_uWS::HttpRequest_*)>_>
       ::empty_cmd;
  local_108.message.erasure_.vtable_.vtable_ =
       fu2::abi_400::detail::type_erasure::invocation_table::
       function_trait<void_(uWS::WebSocket<false,_true>_*,_std::basic_string_view<char,_std::char_traits<char>_>,_uWS::OpCode)>
       ::empty_invoker<true>::invoke;
  local_108.message.erasure_.vtable_.cmd_ =
       fu2::abi_400::detail::type_erasure::tables::
       vtable<fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<false,_true>_*,_std::basic_string_view<char,_std::char_traits<char>_>,_uWS::OpCode)>_>
       ::empty_cmd;
  local_108.drain.erasure_.vtable_.vtable_ =
       fu2::abi_400::detail::type_erasure::invocation_table::
       function_trait<void_(uWS::WebSocket<false,_true>_*)>::empty_invoker<true>::invoke;
  local_108.drain.erasure_.vtable_.cmd_ =
       fu2::abi_400::detail::type_erasure::tables::
       vtable<fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<false,_true>_*)>_>::
       empty_cmd;
  local_108.ping.erasure_.vtable_.vtable_ =
       fu2::abi_400::detail::type_erasure::invocation_table::
       function_trait<void_(uWS::WebSocket<false,_true>_*)>::empty_invoker<true>::invoke;
  local_108.ping.erasure_.vtable_.cmd_ =
       fu2::abi_400::detail::type_erasure::tables::
       vtable<fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<false,_true>_*)>_>::
       empty_cmd;
  local_108.pong.erasure_.vtable_.vtable_ =
       fu2::abi_400::detail::type_erasure::invocation_table::
       function_trait<void_(uWS::WebSocket<false,_true>_*)>::empty_invoker<true>::invoke;
  local_108.pong.erasure_.vtable_.cmd_ =
       fu2::abi_400::detail::type_erasure::tables::
       vtable<fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<false,_true>_*)>_>::
       empty_cmd;
  local_108.close.erasure_.vtable_.vtable_ =
       fu2::abi_400::detail::type_erasure::invocation_table::
       function_trait<void_(uWS::WebSocket<false,_true>_*,_int,_std::basic_string_view<char,_std::char_traits<char>_>)>
       ::empty_invoker<true>::invoke;
  local_108.close.erasure_.vtable_.cmd_ =
       fu2::abi_400::detail::type_erasure::tables::
       vtable<fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<false,_true>_*,_int,_std::basic_string_view<char,_std::char_traits<char>_>)>_>
       ::empty_cmd;
  local_108.compression = SHARED_COMPRESSOR;
  local_108.maxPayloadLength = (this->parameters).maxPayloadLength_bytes;
  local_108.idleTimeout = (this->parameters).tIdleTimeout_s;
  local_1d8[0]._0_8_ = this;
  fu2::abi_400::detail::
  function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<false,_true>_*,_uWS::HttpRequest_*)>_>
  ::
  operator=<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]imgui_ws_third_party_incppect_src_incppect_cpp:88:28),_nullptr,_nullptr,_nullptr,_nullptr>
            (&local_108.open,(anon_class_8_1_8991fb9c_for_value_ *)&local_1d8[0].accessor_);
  local_1f0 = (data_accessor)this;
  local_1d8[0]._0_8_ = this;
  fu2::abi_400::detail::
  function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<false,_true>_*,_std::basic_string_view<char,_std::char_traits<char>_>,_uWS::OpCode)>_>
  ::
  operator=<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]imgui_ws_third_party_incppect_src_incppect_cpp:114:31),_nullptr,_nullptr,_nullptr,_nullptr>
            (&local_108.message,(anon_class_8_1_8991fb9c_for_value_ *)&local_1d8[0].accessor_);
  fu2::abi_400::detail::
  function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<false,_true>_*)>_>
  ::
  operator=<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]imgui_ws_third_party_incppect_src_incppect_cpp:207:29),_nullptr,_nullptr,_nullptr,_nullptr>
            (&local_108.drain,(anon_class_1_0_00000001_for_value_ *)local_1d8);
  fu2::abi_400::detail::
  function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<false,_true>_*)>_>
  ::
  operator=<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]imgui_ws_third_party_incppect_src_incppect_cpp:213:28),_nullptr,_nullptr,_nullptr,_nullptr>
            (&local_108.ping,(anon_class_1_0_00000001_for_value_ *)local_1d8);
  fu2::abi_400::detail::
  function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<false,_true>_*)>_>
  ::
  operator=<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]imgui_ws_third_party_incppect_src_incppect_cpp:216:28),_nullptr,_nullptr,_nullptr,_nullptr>
            (&local_108.pong,(anon_class_1_0_00000001_for_value_ *)local_1d8);
  local_1d8[0].accessor_ = local_1f0;
  fu2::abi_400::detail::
  function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<false,_true>_*,_int,_std::basic_string_view<char,_std::char_traits<char>_>)>_>
  ::
  operator=<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]imgui_ws_third_party_incppect_src_incppect_cpp:219:29),_nullptr,_nullptr,_nullptr,_nullptr>
            (&local_108.close,(anon_class_8_1_8991fb9c_for_value_ *)&local_1d8[0].accessor_);
  app._M_t.
  super___uniq_ptr_impl<uWS::TemplatedApp<false>,_std::default_delete<uWS::TemplatedApp<false>_>_>.
  _M_t.
  super__Tuple_impl<0UL,_uWS::TemplatedApp<false>_*,_std::default_delete<uWS::TemplatedApp<false>_>_>
  .super__Head_base<0UL,_uWS::TemplatedApp<false>_*,_false>._M_head_impl =
       (__uniq_ptr_data<uWS::TemplatedApp<false>,_std::default_delete<uWS::TemplatedApp<false>_>,_true,_true>
        )(__uniq_ptr_impl<uWS::TemplatedApp<false>,_std::default_delete<uWS::TemplatedApp<false>_>_>
         )0x0;
  pTVar5 = (TemplatedApp<false> *)operator_new(0x20);
  uStack_198 = 0;
  uStack_194 = 0;
  uStack_190 = 0;
  uStack_1a8 = 0;
  uStack_1a0 = 0;
  local_19c = 0;
  local_1b8 = 0;
  uStack_1b0 = 0;
  auVar2 = ZEXT1640(ZEXT816(0));
  options._40_8_ = (ulong)uStack_18c << 0x20;
  options.key_file_name = (char *)auVar2._0_8_;
  options.cert_file_name = (char *)auVar2._8_8_;
  options.passphrase = (char *)auVar2._16_8_;
  options.dh_params_file_name = (char *)auVar2._24_8_;
  options.ca_file_name = (char *)auVar2._32_8_;
  uWS::TemplatedApp<false>::TemplatedApp(pTVar5,options);
  std::__uniq_ptr_impl<uWS::TemplatedApp<false>,_std::default_delete<uWS::TemplatedApp<false>_>_>::
  reset((__uniq_ptr_impl<uWS::TemplatedApp<false>,_std::default_delete<uWS::TemplatedApp<false>_>_>
         *)&app,pTVar5);
  uVar3 = app;
  if (*(long *)app._M_t.
               super___uniq_ptr_impl<uWS::TemplatedApp<false>,_std::default_delete<uWS::TemplatedApp<false>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_uWS::TemplatedApp<false>_*,_std::default_delete<uWS::TemplatedApp<false>_>_>
               .super__Head_base<0UL,_uWS::TemplatedApp<false>_*,_false>._M_head_impl == 0) {
    puts("[incppect] failed to construct uWS server!");
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_148,"/incppect",(allocator<char> *)&local_1e0);
    pTVar5 = uWS::TemplatedApp<false>::ws<Incppect<false>::Impl::PerSocketData>
                       ((TemplatedApp<false> *)
                        uVar3._M_t.
                        super___uniq_ptr_impl<uWS::TemplatedApp<false>,_std::default_delete<uWS::TemplatedApp<false>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_uWS::TemplatedApp<false>_*,_std::default_delete<uWS::TemplatedApp<false>_>_>
                        .super__Head_base<0UL,_uWS::TemplatedApp<false>_*,_false>._M_head_impl,
                        &local_148,&local_108);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_168,"/incppect.js",&local_1f2);
    fu2::abi_400::detail::
    function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::HttpResponse<false>_*,_uWS::HttpRequest_*)>_>
    ::
    function<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]imgui_ws_third_party_incppect_src_incppect_cpp:256:31),_nullptr,_nullptr,_nullptr,_nullptr>
              ((function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::HttpResponse<false>_*,_uWS::HttpRequest_*)>_>
                *)local_1d8,&local_1f1);
    uWS::TemplatedApp<false>::get
              (pTVar5,&local_168,
               (unique_function<void_(HttpResponse<false>_*,_HttpRequest_*)> *)local_1d8);
    fu2::abi_400::detail::type_erasure::
    erasure<true,_fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::HttpResponse<false>_*,_uWS::HttpRequest_*)>_>
    ::~erasure((erasure<true,_fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::HttpResponse<false>_*,_uWS::HttpRequest_*)>_>
                *)local_1d8);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_148);
    pbVar1 = *(pointer *)(local_1f0.inplace_storage_ + 0x40);
    for (__rhs = (((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(local_1f0.inplace_storage_ + 0x38))->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar3._M_t.
        super___uniq_ptr_impl<uWS::TemplatedApp<false>,_std::default_delete<uWS::TemplatedApp<false>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_uWS::TemplatedApp<false>_*,_std::default_delete<uWS::TemplatedApp<false>_>_>
        .super__Head_base<0UL,_uWS::TemplatedApp<false>_*,_false>._M_head_impl =
             app._M_t.
             super___uniq_ptr_impl<uWS::TemplatedApp<false>,_std::default_delete<uWS::TemplatedApp<false>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_uWS::TemplatedApp<false>_*,_std::default_delete<uWS::TemplatedApp<false>_>_>
             .super__Head_base<0UL,_uWS::TemplatedApp<false>_*,_false>._M_head_impl, __rhs != pbVar1
        ; __rhs = __rhs + 1) {
      std::operator+(&local_128,"/",__rhs);
      local_1e0.ptr_ = local_1f0.ptr_;
      fu2::abi_400::detail::
      function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::HttpResponse<false>_*,_uWS::HttpRequest_*)>_>
      ::
      function<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]imgui_ws_third_party_incppect_src_incppect_cpp:260:40),_nullptr,_nullptr,_nullptr,_nullptr>
                ((function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::HttpResponse<false>_*,_uWS::HttpRequest_*)>_>
                  *)local_1d8,(anon_class_8_1_8991fb9c_for_value_ *)&local_1e0);
      uWS::TemplatedApp<false>::get
                ((TemplatedApp<false> *)
                 uVar3._M_t.
                 super___uniq_ptr_impl<uWS::TemplatedApp<false>,_std::default_delete<uWS::TemplatedApp<false>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_uWS::TemplatedApp<false>_*,_std::default_delete<uWS::TemplatedApp<false>_>_>
                 .super__Head_base<0UL,_uWS::TemplatedApp<false>_*,_false>._M_head_impl,&local_128,
                 (unique_function<void_(HttpResponse<false>_*,_HttpRequest_*)> *)local_1d8);
      fu2::abi_400::detail::type_erasure::
      erasure<true,_fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::HttpResponse<false>_*,_uWS::HttpRequest_*)>_>
      ::~erasure((erasure<true,_fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::HttpResponse<false>_*,_uWS::HttpRequest_*)>_>
                  *)local_1d8);
      std::__cxx11::string::~string((string *)&local_128);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,"/*",&local_1f2);
    local_1e0.ptr_ = local_1f0.ptr_;
    fu2::abi_400::detail::
    function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::HttpResponse<false>_*,_uWS::HttpRequest_*)>_>
    ::
    function<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]imgui_ws_third_party_incppect_src_incppect_cpp:301:26),_nullptr,_nullptr,_nullptr,_nullptr>
              ((function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::HttpResponse<false>_*,_uWS::HttpRequest_*)>_>
                *)local_1d8,(anon_class_8_1_8991fb9c_for_value_ *)&local_1e0);
    uWS::TemplatedApp<false>::get
              ((TemplatedApp<false> *)
               uVar3._M_t.
               super___uniq_ptr_impl<uWS::TemplatedApp<false>,_std::default_delete<uWS::TemplatedApp<false>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_uWS::TemplatedApp<false>_*,_std::default_delete<uWS::TemplatedApp<false>_>_>
               .super__Head_base<0UL,_uWS::TemplatedApp<false>_*,_false>._M_head_impl,&local_188,
               (unique_function<void_(HttpResponse<false>_*,_HttpRequest_*)> *)local_1d8);
    fu2::abi_400::detail::type_erasure::
    erasure<true,_fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::HttpResponse<false>_*,_uWS::HttpRequest_*)>_>
    ::~erasure((erasure<true,_fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::HttpResponse<false>_*,_uWS::HttpRequest_*)>_>
                *)local_1d8);
    std::__cxx11::string::~string((string *)&local_188);
    uVar3 = app;
    __fd = *local_1f0.ptr_;
    local_1e0.ptr_ = local_1f0.ptr_;
    fu2::abi_400::detail::
    function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(us_listen_socket_t_*)>_>
    ::
    function<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]imgui_ws_third_party_incppect_src_incppect_cpp:308:46),_nullptr,_nullptr,_nullptr,_nullptr>
              ((function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(us_listen_socket_t_*)>_>
                *)local_1d8,(anon_class_8_1_8991fb9c_for_value_ *)&local_1e0);
    uWS::TemplatedApp<false>::listen
              ((TemplatedApp<false> *)
               uVar3._M_t.
               super___uniq_ptr_impl<uWS::TemplatedApp<false>,_std::default_delete<uWS::TemplatedApp<false>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_uWS::TemplatedApp<false>_*,_std::default_delete<uWS::TemplatedApp<false>_>_>
               .super__Head_base<0UL,_uWS::TemplatedApp<false>_*,_false>._M_head_impl,__fd,
               (int)local_1d8);
    uWS::run();
    fu2::abi_400::detail::type_erasure::
    erasure<true,_fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(us_listen_socket_t_*)>_>
    ::~erasure((erasure<true,_fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(us_listen_socket_t_*)>_>
                *)local_1d8);
  }
  std::unique_ptr<uWS::TemplatedApp<false>,_std::default_delete<uWS::TemplatedApp<false>_>_>::
  ~unique_ptr(&app);
  uWS::TemplatedApp<false>::WebSocketBehavior::~WebSocketBehavior(&local_108);
  return;
}

Assistant:

void run() {
        mainLoop = uWS::Loop::get();

        {
            const char * kProtocol = SSL ? "HTTPS" : "HTTP";
            my_printf("[incppect] running instance. serving %s from '%s'\n", kProtocol, parameters.httpRoot.c_str());
        }

        typename uWS::TemplatedApp<SSL>::WebSocketBehavior wsBehaviour;
        wsBehaviour.compression = uWS::SHARED_COMPRESSOR;
        wsBehaviour.maxPayloadLength = parameters.maxPayloadLength_bytes;
        wsBehaviour.idleTimeout = parameters.tIdleTimeout_s;
        wsBehaviour.open = [&](auto * ws, auto * /*req*/) {
            static int32_t uniqueId = 1;
            ++uniqueId;

            auto & cd = clientData[uniqueId];
            cd.tConnected_ms = ::timestamp();

            auto addressBytes = ws->getRemoteAddress();
            cd.ipAddress[0] = addressBytes[12];
            cd.ipAddress[1] = addressBytes[13];
            cd.ipAddress[2] = addressBytes[14];
            cd.ipAddress[3] = addressBytes[15];

            auto sd = (PerSocketData *) ws->getUserData();
            sd->clientId = uniqueId;
            sd->ws = ws;
            sd->mainLoop = uWS::Loop::get();

            socketData.insert({ uniqueId, sd });

            my_printf("[incppect] client with id = %d connected\n", sd->clientId);

            if (handler) {
                handler(sd->clientId, Connect, { (const char *) cd.ipAddress, 4 } );
            }
        };
        wsBehaviour.message = [this](auto * ws, std::string_view message, uWS::OpCode /*opCode*/) {
            rxTotal_bytes += message.size();
            if (message.size() < sizeof(int)) {
                return;
            }

            int32_t type = -1;
            std::memcpy((char *)(&type), message.data(), sizeof(type));

            bool doUpdate = true;

            auto sd = (PerSocketData *) ws->getUserData();
            auto & cd = clientData[sd->clientId];

            switch (type) {
                case 1:
                    {
                        std::stringstream ss(message.data() + 4);
                        while (true) {
                            Request request;

                            std::string path;
                            ss >> path;
                            if (ss.eof()) break;
                            int requestId = 0;
                            ss >> requestId;
                            int nidxs = 0;
                            ss >> nidxs;
                            for (int i = 0; i < nidxs; ++i) {
                                int idx = 0;
                                ss >> idx;
                                if (idx == -1) idx = sd->clientId;
                                request.idxs.push_back(idx);
                            }

                            if (pathToGetter.find(path) != pathToGetter.end()) {
                                my_printf("[incppect] requestId = %d, path = '%s', nidxs = %d\n", requestId, path.c_str(), nidxs);
                                request.getterId = pathToGetter[path];

                                cd.requests[requestId] = std::move(request);
                            } else {
                                my_printf("[incppect] missing path '%s'\n", path.c_str());
                            }
                        }
                    }
                    break;
                case 2:
                    {
                        int nRequests = (message.size() - sizeof(int32_t))/sizeof(int32_t);
                        if (nRequests*sizeof(int32_t) + sizeof(int32_t) != message.size()) {
                            my_printf("[incppect] error : invalid message data!\n");
                            return;
                        }
                        my_printf("[incppect] received requests: %d\n", nRequests);

                        cd.lastRequests.clear();
                        for (int i = 0; i < nRequests; ++i) {
                            int32_t curRequest = -1;
                            std::memcpy((char *)(&curRequest), message.data() + 4*(i + 1), sizeof(curRequest));
                            if (cd.requests.find(curRequest) != cd.requests.end()) {
                                cd.lastRequests.push_back(curRequest);
                                cd.requests[curRequest].tLastRequested_ms = ::timestamp();
                                cd.requests[curRequest].tLastRequestTimeout_ms = parameters.tLastRequestTimeout_ms;
                            }
                        }
                    }
                    break;
                case 3:
                    {
                        for (auto curRequest : cd.lastRequests) {
                            if (cd.requests.find(curRequest) != cd.requests.end()) {
                                cd.requests[curRequest].tLastRequested_ms = ::timestamp();
                                cd.requests[curRequest].tLastRequestTimeout_ms = parameters.tLastRequestTimeout_ms;
                            }
                        }
                    }
                    break;
                case 4:
                    {
                        doUpdate = false;
                        if (handler && message.size() > sizeof(int32_t)) {
                            handler(sd->clientId, Custom, { message.data() + sizeof(int32_t), message.size() - sizeof(int32_t) } );
                        }
                    }
                    break;
                default:
                    my_printf("[incppect] unknown message type: %d\n", type);
            };

            if (doUpdate) {
                sd->mainLoop->defer([this]() { this->update(); });
            }
        };
        wsBehaviour.drain = [](auto *ws) {
            /* Check getBufferedAmount here */
            if (ws->getBufferedAmount() > 0) {
                my_printf("[incppect] drain: buffered amount = %d\n", ws->getBufferedAmount());
            }
        };
        wsBehaviour.ping = [](auto * /*ws*/) {

        };
        wsBehaviour.pong = [](auto * /*ws*/) {

        };
        wsBehaviour.close = [this](auto * ws, int /*code*/, std::string_view /*message*/) {
            auto sd = (PerSocketData *) ws->getUserData();
            my_printf("[incppect] client with id = %d disconnected\n", sd->clientId);

            clientData.erase(sd->clientId);
            socketData.erase(sd->clientId);

            if (handler) {
                handler(sd->clientId, Disconnect, { nullptr, 0 } );
            }
        };

        std::unique_ptr<uWS::TemplatedApp<SSL>> app;

        if constexpr (SSL) {
            us_socket_context_options_t ssl_options = {};

            ssl_options.key_file_name = parameters.sslKey.data();
            ssl_options.cert_file_name = parameters.sslCert.data();

            app.reset(new uWS::TemplatedApp<SSL>(ssl_options));
        } else {
            app.reset(new uWS::TemplatedApp<SSL>());
        }

        if (app->constructorFailed()) {
            my_printf("[incppect] failed to construct uWS server!\n");
            if (SSL) {
                my_printf("[incppect] verify that you have valid certificate files:\n");
                my_printf("[incppect] key  file : '%s'\n", parameters.sslKey.c_str());
                my_printf("[incppect] cert file : '%s'\n", parameters.sslCert.c_str());
            }

            return;
        }

        (*app).template ws<PerSocketData>("/incppect", std::move(wsBehaviour)
        ).get("/incppect.js", [](auto *res, auto * /*req*/) {
                res->end(kIncppect_js);
        });
        for (const auto & resource : parameters.resources) {
            (*app).get("/" + resource, [this](auto *res, auto *req) {
                std::string url = std::string(req->getUrl());
                my_printf("url = '%s'\n", url.c_str());

                if (url.size() == 0) {
                    res->end("Resource not found");
                    return;
                }

                if (url[url.size() - 1] == '/') {
                    url += "index.html";
                }

                if (resources.find(url) != resources.end()) {
                    res->end(resources[url]);
                    return;
                }

                my_printf("resource = '%s'\n", (parameters.httpRoot + url).c_str());
                std::ifstream fin(parameters.httpRoot + url);

                if (fin.is_open() == false || fin.good() == false) {
                    res->end("Resource not found");
                    return;
                }

                const std::string str((std::istreambuf_iterator<char>(fin)),
                                      std::istreambuf_iterator<char>());

                if (str.size() == 0) {
                    res->end("Resource not found");
                    return;
                }

                if (hasExt(req->getUrl(), ".js")) {
                    res->writeHeader("Content-Type", "text/javascript");
                }

                res->end(str);
            });
        }
        (*app).get("/*", [this](auto *res, auto *req) {
            const std::string url = std::string(req->getUrl());
            my_printf("url = '%s'\n", url.c_str());

            res->end("Resource not found");
            return;
        });
        (*app).listen(parameters.portListen, [this](auto *token) {
            this->listenSocket = token;
            if (token) {
                my_printf("[incppect] listening on port %d\n", parameters.portListen);

                const char * kProtocol = SSL ? "https" : "http";
                my_printf("[incppect] %s://localhost:%d/\n", kProtocol, parameters.portListen);
            }
        }).run();
    }